

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricHeaterType::IfcElectricHeaterType(IfcElectricHeaterType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_008a0070;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcElectricHeaterType";
  Schema_2x3::IfcFlowTerminalType::IfcFlowTerminalType
            (&this->super_IfcFlowTerminalType,&PTR_construction_vtable_24__008da9c0);
  *(undefined8 *)&(this->super_IfcFlowTerminalType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x8da840;
  *(undefined8 *)&this->field_0x1e0 = 0x8da9a8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x8da868;
  (this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8da890;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x8da8b8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x8da8e0;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x8da908;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x8da930;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x8da958;
  *(undefined8 *)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0x8da980;
  *(undefined1 **)&(this->super_IfcFlowTerminalType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcElectricHeaterType() : Object("IfcElectricHeaterType") {}